

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

int cmp_D2A(Bigint *a,Bigint *b)

{
  int iVar1;
  uint *puVar2;
  int j;
  int i;
  ULong *xb0;
  ULong *xb;
  ULong *xa0;
  ULong *xa;
  Bigint *b_local;
  Bigint *a_local;
  
  iVar1 = b->wds;
  a_local._4_4_ = a->wds - iVar1;
  if (a_local._4_4_ == 0) {
    xb0 = b->x + iVar1;
    xa0 = a->x + iVar1;
    do {
      puVar2 = xa0 + -1;
      if (xa0[-1] != xb0[-1]) {
        if (xb0[-1] <= *puVar2) {
          return 1;
        }
        return -1;
      }
      xb0 = xb0 + -1;
      xa0 = puVar2;
    } while (a->x < puVar2);
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

int
cmp
#ifdef KR_headers
	(a, b) Bigint *a, *b;
#else
	(Bigint *a, Bigint *b)
#endif
{
	ULong *xa, *xa0, *xb, *xb0;
	int i, j;

	i = a->wds;
	j = b->wds;
#ifdef DEBUG
	if (i > 1 && !a->x[i-1])
		Bug("cmp called with a->x[a->wds-1] == 0");
	if (j > 1 && !b->x[j-1])
		Bug("cmp called with b->x[b->wds-1] == 0");
#endif
	if (i -= j)
		return i;
	xa0 = a->x;
	xa = xa0 + j;
	xb0 = b->x;
	xb = xb0 + j;
	for(;;) {
		if (*--xa != *--xb)
			return *xa < *xb ? -1 : 1;
		if (xa <= xa0)
			break;
		}
	return 0;
	}